

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O2

void * NES_APU_np_Create(UINT32 clock,UINT32 rate)

{
  void *chip;
  long lVar1;
  NES_APU *apu;
  
  chip = calloc(1,0x178);
  if (chip != (void *)0x0) {
    *(UINT32 *)((long)chip + 0x60) = clock;
    NES_APU_np_SetRate(chip,rate);
    *(undefined8 *)((long)chip + 8) = 0x100000001;
    *(undefined8 *)((long)chip + 0x10) = 1;
    *(undefined4 *)((long)chip + 0x18) = 0;
    *(undefined4 *)((long)chip + 100) = 0;
    lVar1 = 0;
    while (lVar1 != 0x1f) {
      *(int *)((long)chip + lVar1 * 4 + 0x68) =
           (int)(785448.96 / (8128.0 / (double)(int)(lVar1 + 1) + 100.0));
      lVar1 = lVar1 + 1;
    }
    *(undefined4 *)((long)chip + 0xe4) = *(undefined4 *)((long)chip + 0xa0);
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      *(undefined8 *)((long)chip + lVar1 * 8 + 0x20) = 0x8000000080;
    }
    *(undefined4 *)((long)chip + 0x1c) = 0;
  }
  return chip;
}

Assistant:

void* NES_APU_np_Create(UINT32 clock, UINT32 rate)
{
	NES_APU* apu;
	int i, c, t;

	apu = (NES_APU*)calloc(1, sizeof(NES_APU));
	if (apu == NULL)
		return NULL;

	NES_APU_np_SetClock(apu, clock);
	NES_APU_np_SetRate(apu, rate);
	apu->option[OPT_UNMUTE_ON_RESET] = true;
	apu->option[OPT_PHASE_REFRESH] = true;
	apu->option[OPT_NONLINEAR_MIXER] = true;
	apu->option[OPT_DUTY_SWAP] = false;
	apu->option[OPT_NEGATE_SWEEP_INIT] = false;

	apu->square_table[0] = 0;
	for(i=1;i<32;i++)
		apu->square_table[i]=(INT32)((8192.0*95.88)/(8128.0/i+100));

	apu->square_linear = apu->square_table[15]; // match linear scale to one full volume square of nonlinear

	for(c=0;c<2;++c)
		for(t=0;t<2;++t)
			apu->sm[c][t] = 128;

	apu->mask = 0;

	return apu;
}